

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.cpp
# Opt level: O2

void __thiscall HighsTaskExecutor::ExecutorHandle::dispose(ExecutorHandle *this)

{
  HighsTaskExecutor *this_00;
  Deleter<HighsTaskExecutor> local_9;
  
  this_00 = this->ptr;
  if (this_00 != (HighsTaskExecutor *)0x0) {
    if (this->isMain == true) {
      stopWorkerThreads(this_00,false);
      this_00 = this->ptr;
    }
    LOCK();
    (this_00->referenceCount).super___atomic_base<int>._M_i =
         (this_00->referenceCount).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((this_00->referenceCount).super___atomic_base<int>._M_i == 0) {
      ::highs::cache_aligned::Deleter<HighsTaskExecutor>::operator()(&local_9,this->ptr);
    }
    this->ptr = (HighsTaskExecutor *)0x0;
  }
  return;
}

Assistant:

void HighsTaskExecutor::ExecutorHandle::dispose() {
  if (ptr == nullptr) return;
  if (isMain) {
    ptr->stopWorkerThreads(false);
  }

  // check to see if we are the last handle and if so, delete the executor
  if (--ptr->referenceCount == 0) {
    cache_aligned::Deleter<HighsTaskExecutor>()(ptr);
  }

  ptr = nullptr;
}